

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splayTest.cpp
# Opt level: O0

void testConfigurationCorrectness(int dataCount,int minimumN)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  ostream *poVar4;
  double dVar5;
  double averageError;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1f0;
  duration<long,_std::ratio<1L,_1000L>_> local_1e8;
  rep local_1e0;
  rep millisecAfterSimulation;
  double mbhWeight;
  double weight;
  double dStack_1c0;
  int idx;
  double tau;
  bool spin;
  bool isInsert;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_1b0;
  int i;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1a8;
  duration<long,_std::ratio<1L,_1000L>_> local_1a0;
  rep local_198;
  rep millisecBeforeSimulation;
  double averageN;
  double totalError;
  double dWeightF;
  double dWeightJL;
  SplayWeightConfiguration c;
  undefined1 local_68 [7];
  bool efficiencyTest;
  vector<double,_std::allocator<double>_> aF;
  undefined1 local_40 [8];
  vector<double,_std::allocator<double>_> aL;
  vector<double,_std::allocator<double>_> aJ;
  int minimumN_local;
  int dataCount_local;
  
  randomVector((vector<double,_std::allocator<double>_> *)
               &aL.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,mJ + 1);
  randomVector((vector<double,_std::allocator<double>_> *)local_40,mL + 1);
  randomVector((vector<double,_std::allocator<double>_> *)local_68,mF + 1);
  c.momentSplay[1]._7_1_ = 0;
  SplayWeightConfiguration::SplayWeightConfiguration
            ((SplayWeightConfiguration *)&dWeightJL,
             (vector<double,_std::allocator<double>_> *)
             &aL.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(vector<double,_std::allocator<double>_> *)local_40,
             (vector<double,_std::allocator<double>_> *)local_68);
  averageN = 0.0;
  millisecBeforeSimulation = 0;
  tStack_1b0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_1a8.__r =
       (rep)std::chrono::
            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::time_since_epoch(&stack0xfffffffffffffe50);
  local_1a0.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_1a8);
  local_198 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_1a0);
  for (tau._4_4_ = 0; tau._4_4_ < dataCount; tau._4_4_ = tau._4_4_ + 1) {
    iVar2 = randomInt(2);
    tau._3_1_ = iVar2 != 0;
    if ((bool)tau._3_1_) {
      iVar2 = randomInt(2);
      tau._2_1_ = iVar2 != 0;
      dStack_1c0 = generateDataPoint();
      dWeightF = SplayWeightConfiguration::insertDeltaWeightJL
                           ((SplayWeightConfiguration *)&dWeightJL,(bool)(tau._2_1_ & 1),dStack_1c0)
      ;
      totalError = SplayWeightConfiguration::insertDeltaWeightF
                             ((SplayWeightConfiguration *)&dWeightJL);
      SplayWeightConfiguration::insertSpin
                ((SplayWeightConfiguration *)&dWeightJL,(bool)(tau._2_1_ & 1),dStack_1c0);
      SplayWeightConfiguration::updateWeight
                ((SplayWeightConfiguration *)&dWeightJL,dWeightF,totalError);
    }
    else if (minimumN <
             (int)c.spf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      weight._4_4_ = randomInt((int)c.spf.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar3 = std::vector<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>::
               operator[]((vector<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>
                           *)&dWeightJL,(long)weight._4_4_);
      bVar1 = pvVar3->first;
      pvVar3 = std::vector<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>::
               operator[]((vector<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>
                           *)&dWeightJL,(long)weight._4_4_);
      dWeightF = SplayWeightConfiguration::removeDeltaWeightJL
                           ((SplayWeightConfiguration *)&dWeightJL,(bool)(bVar1 & 1),pvVar3->second)
      ;
      totalError = SplayWeightConfiguration::removeDeltaWeightF
                             ((SplayWeightConfiguration *)&dWeightJL);
      SplayWeightConfiguration::updateWeight
                ((SplayWeightConfiguration *)&dWeightJL,dWeightF,totalError);
      SplayWeightConfiguration::removeSpin((SplayWeightConfiguration *)&dWeightJL,weight._4_4_);
    }
    if ((c.momentSplay[1]._7_1_ & 1) == 0) {
      mbhWeight = SplayWeightConfiguration::getWeight((SplayWeightConfiguration *)&dWeightJL);
      millisecAfterSimulation =
           (rep)SplayWeightConfiguration::bruteForceMBH((SplayWeightConfiguration *)&dWeightJL);
      averageN = ABS((mbhWeight - (double)millisecAfterSimulation) / (double)millisecAfterSimulation
                    ) + averageN;
    }
    millisecBeforeSimulation =
         (rep)((double)(int)c.spf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage +
              (double)millisecBeforeSimulation);
  }
  averageError = (double)std::chrono::_V2::system_clock::now();
  local_1f0.__r =
       (rep)std::chrono::
            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&averageError);
  local_1e8.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_1f0);
  local_1e0 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_1e8);
  millisecBeforeSimulation = (rep)((double)millisecBeforeSimulation / (double)dataCount);
  if ((c.momentSplay[1]._7_1_ & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Test the efficiency for a simulation of ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dataCount);
    poVar4 = std::operator<<(poVar4," steps.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        ((double)(local_1e0 - local_198) * 1000000.0) / (double)dataCount);
    poVar4 = std::operator<<(poVar4," milliseconds for 10^6 steps, with average n = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(double)millisecBeforeSimulation);
    poVar4 = std::operator<<(poVar4,", (mL, mJ, mF) = (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,mL);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,mJ);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,mF);
    poVar4 = std::operator<<(poVar4,").");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  if ((c.momentSplay[1]._7_1_ & 1) == 0) {
    dVar5 = averageN / (double)dataCount;
    poVar4 = std::operator<<((ostream *)&std::cout,"average error for m^2 configuration = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  SplayWeightConfiguration::~SplayWeightConfiguration((SplayWeightConfiguration *)&dWeightJL);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_68);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &aL.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  return;
}

Assistant:

void testConfigurationCorrectness(int dataCount = 10000, int minimumN = 30) {
    // run a test of dataCount steps, n cannot be decreased if lower than minimumN
    // test the correctness by comparing with O(n^2) weight calculation
    vector<double> aJ = randomVector(mJ + 1);
    vector<double> aL = randomVector(mL + 1);
    vector<double> aF = randomVector(mF + 1);
    bool efficiencyTest = false;
    SplayWeightConfiguration c(aJ, aL, aF);
    double dWeightJL, dWeightF;
    double totalError = 0.0;
    // int dataCount = 10000;
    double averageN = 0;

    auto millisecBeforeSimulation = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();
    for (int i = 0; i < dataCount; ++i) {
        bool isInsert = randomInt(2);
        if (isInsert) {
            bool spin = randomInt(2);
            double tau = generateDataPoint();
            dWeightJL = c.insertDeltaWeightJL(spin, tau);
            dWeightF = c.insertDeltaWeightF();
            c.insertSpin(spin, tau);
            c.updateWeight(dWeightJL, dWeightF);
        } else if (c.n > minimumN) {
            int idx = randomInt(c.n);
            dWeightJL = c.removeDeltaWeightJL(c.c[idx].first, c.c[idx].second);
            dWeightF = c.removeDeltaWeightF();
            c.updateWeight(dWeightJL, dWeightF);
            c.removeSpin(idx);
        }
        if (!efficiencyTest) {
            double weight = c.getWeight(), mbhWeight = c.bruteForceMBH();
            totalError += fabs((weight - mbhWeight) / mbhWeight);
        }

        averageN += c.n;
    }
    auto millisecAfterSimulation = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();
    averageN /= dataCount;
    if (efficiencyTest) {
        cout << "Test the efficiency for a simulation of " << dataCount << " steps." << endl;
        cout << (millisecAfterSimulation - millisecBeforeSimulation) * 1000000.0 / dataCount << " milliseconds for 10^6 steps, with average n = " << averageN << ", (mL, mJ, mF) = (" << mL << ", " << mJ << ", " << mF << ")." << endl;
    }
    if (!efficiencyTest) {
        double averageError = totalError / dataCount;
        cout << "average error for m^2 configuration = " << averageError << endl;
    }
    // c.printA();
}